

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextSpecsOf.hpp
# Opt level: O2

AxisLabelSpecs * __thiscall
sciplot::TextSpecsOf<sciplot::AxisLabelSpecs>::textColor
          (TextSpecsOf<sciplot::AxisLabelSpecs> *this,string *color)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&bStack_58,"\'",color);
  std::operator+(&local_38,&bStack_58,"\'");
  std::__cxx11::string::operator=((string *)&this->m_color,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_58);
  return (AxisLabelSpecs *)this;
}

Assistant:

auto TextSpecsOf<DerivedSpecs>::textColor(std::string color) -> DerivedSpecs&
{
    m_color = "'" + color + "'";
    return static_cast<DerivedSpecs&>(*this);
}